

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::EventLoop::queueInLoop(EventLoop *this,Functor *cb)

{
  bool bVar1;
  MutexLockGuard local_20;
  MutexLockGuard lock;
  Functor *cb_local;
  EventLoop *this_local;
  
  lock.m_mutex = (MutexLock *)cb;
  MutexLockGuard::MutexLockGuard(&local_20,&this->m_mutex);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
            (&this->m_pendingFunctors,cb);
  MutexLockGuard::~MutexLockGuard(&local_20);
  bVar1 = isInLoopThread(this);
  if ((!bVar1) || ((this->m_callingPendingFunctors & 1U) != 0)) {
    wakeup(this);
  }
  return;
}

Assistant:

void EventLoop::queueInLoop(Functor cb)
{
	// 把任务加入到队列可能同时被多个线程调用，需要加锁
	{
		MutexLockGuard lock(m_mutex);
		m_pendingFunctors.push_back(std::move(cb));
	}

	// 1.调用queueInLoop的线程不是当前IO线程则需要唤醒当前IO线程，才能及时执行doPendingFunctors();
	// 2.调用queueInLoop的线程是当前IO线程（比如在doPendingFunctors()中执行functors[i]()时又调用了queueInLoop()）
	// 并且此时正在调用pending functor，需要唤醒当前IO线程，因为在此时doPendingFunctors() 过程中又添加了任务，
	// 故循环回去poll的时候需要被唤醒返回，进而继续执行doPendingFunctors()
	// 3.只有在当前IO线程的事件回调中调用queueInLoop才不需要唤醒
	// 即在handleEvent()中调用queueInLoop不需要唤醒，因为接下来马上就会执行doPendingFunctors();
	if (!isInLoopThread() || m_callingPendingFunctors)
	{
		wakeup();
	}
}